

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

uint * __thiscall
CAPSFile::ExtractDensity
          (CAPSFile *this,uchar *buffer,int density_buf_size,uint ctype,uint cyl,uint head)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  char buff [128];
  char local_b8 [136];
  
  uVar11 = *(uint *)(buffer + 4);
  uVar3 = (uVar11 & 0xff0000) >> 8;
  uVar4 = (uVar11 & 0xff00) << 8;
  uVar14 = uVar11 >> 0x18 | uVar3 | uVar4 | uVar11 << 0x18;
  uVar6 = uVar14 >> 2;
  puVar7 = (uint *)operator_new__((ulong)(uVar11 >> 0x18 & 0xfffffffc | uVar3 | uVar4 |
                                         uVar11 << 0x18));
  if (3 < uVar14) {
    puVar8 = puVar7 + uVar6;
    do {
      uVar9 = (ulong)(density_buf_size - 1);
      bVar1 = buffer[uVar9];
      switch(bVar1 & 3) {
      case 0:
        if ((bVar1 & 8) == 0) {
          iVar10 = (bVar1 >> 4) + 1;
        }
        else {
          uVar9 = (ulong)(density_buf_size - 2);
          iVar10 = CONCAT31((int3)(((uint)bVar1 << 4) >> 8),buffer[uVar9]);
        }
        density_buf_size = (int)uVar9;
        if ((bVar1 & 4) == 0) {
          for (; iVar10 != 0; iVar10 = iVar10 + -1) {
            density_buf_size = (int)uVar9 - 1;
            uVar9 = (ulong)(uint)density_buf_size;
            puVar8[-1] = (uint)buffer[uVar9];
            puVar8 = puVar8 + -1;
          }
        }
        else if (iVar10 != 0) {
          iVar12 = 0;
          lVar15 = 0;
          do {
            iVar5 = (int)lVar15;
            *(uint *)((long)puVar8 + lVar15 + -4) =
                 (uint)buffer[(density_buf_size - 4U) + iVar5] |
                 ((uint)buffer[(density_buf_size - 3U) + iVar5] |
                 (uint)buffer[(density_buf_size - 2U) + iVar5] << 8 |
                 (uint)buffer[(density_buf_size - 1U) + iVar5] << 0x10) << 8;
            lVar15 = lVar15 + -4;
            iVar12 = iVar12 + 4;
          } while (iVar10 << 2 != iVar12);
          puVar8 = (uint *)((long)puVar8 + lVar15);
          density_buf_size = density_buf_size - iVar12;
        }
        goto LAB_0012e812;
      case 1:
        uVar9 = (ulong)((bVar1 >> 2) + 1);
        density_buf_size = density_buf_size - 2;
        uVar13 = (ulong)buffer[(uint)density_buf_size] + 1;
        goto LAB_0012e7f7;
      case 2:
        uVar9 = (ulong)((bVar1 >> 2) + 1);
        uVar2 = buffer[density_buf_size - 2];
        density_buf_size = density_buf_size - 3;
        break;
      case 3:
        uVar9 = CONCAT71((int7)(((ulong)bVar1 << 6) >> 8),buffer[density_buf_size - 2]);
        uVar2 = buffer[density_buf_size - 3];
        density_buf_size = density_buf_size - 4;
      }
      uVar13 = (ulong)CONCAT11(uVar2,buffer[(uint)density_buf_size]);
LAB_0012e7f7:
      uVar11 = (uint)uVar9;
      while (uVar11 != 0) {
        puVar8[-1] = puVar8[uVar13 - 1];
        puVar8 = puVar8 + -1;
        uVar11 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar11;
      }
LAB_0012e812:
    } while (puVar7 < puVar8);
  }
  if ((cyl == 0x12) && (3 < uVar14)) {
    uVar9 = 1;
    if (1 < uVar6) {
      uVar9 = (ulong)uVar6;
    }
    uVar13 = 0;
    do {
      if (puVar7[uVar13] - 0x11 < 0xfffffffc) {
        sprintf(local_b8," index = %i - Valeur = %2.2X ",uVar13 & 0xffffffff);
      }
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  return puVar7;
}

Assistant:

unsigned int* CAPSFile::ExtractDensity(unsigned char* buffer, int density_buf_size, DWORD ctype, DWORD cyl, DWORD head)
{
   unsigned int usize = ExtractInt(&buffer[4]);
   unsigned int ucrc = ExtractInt(&buffer[8]);; // CRC on uncompressed data
   unsigned int csize = ExtractInt(&buffer[12]);; // compressed size in bytes
   unsigned int ccrc = ExtractInt(&buffer[16]);; // CRC on compressed data
   unsigned int hcrc = ExtractInt(&buffer[20]);; // CRC on header calculated as hcrc=0

   // density
   unsigned int* buf = new unsigned int[usize >> 2];

   // Ptr to end of buffer
   unsigned int* mem = &buf[usize >> 2];
   unsigned int offset_source = density_buf_size;

   // Decode data :
   while (mem > buf)
   {
      int size, ofs = 0;
      unsigned char cb0 = buffer[--offset_source];

      switch (cb0 & 0x03)
      {
      case 0x0: // data block
         // 14 or 4 bit size
         if (cb0 & 0x8)
         {
            size = ((cb0 << 4) & 0xF00) | (buffer[--offset_source]);
         }
         else
         {
            size = (cb0 >> 4) + 1;
         }
         if (cb0 & 0x4)
         {
            // 4 byte per value
            while (size--)
            {
               unsigned int data;
               data = buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               *--mem = data;
            }
         }
         else
         {
            while (size--)
            {
               *--mem = buffer[--offset_source];
            }
         }
         continue;

      case 0x1: // copy block, 8bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source] + 1;
         break;
      case 0x2: // copy block, 16 bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      case 0x3: // Copy block, 16 bit offset, 14 bit size
         size = ((cb0 << 6) & 0x3F00) | buffer[--offset_source];
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      }

      while (size--)
      {
         mem--;
         *mem = mem[ofs];
      }
   }


   if (cyl == 0x12)
   {
      int nbDens = (usize >> 2);
      for (int i = 0; i < nbDens; i++)
      {
         if (buf[i] >= 0x11 || buf[i] <= 0x0C)
         {
            char buff[128];
            sprintf(buff, " index = %i - Valeur = %2.2X ", i, buf[i]);
            OutputDebugString (buff);
         }
      }
   }

   return buf;
}